

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O1

void __thiscall
GuidedMeshNormalFiltering::getRadiusBasedFaceNeighbor
          (GuidedMeshNormalFiltering *this,TriMesh *mesh,FaceHandle fh,double radius,
          vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *face_neighbor)

{
  pointer *ppFVar1;
  pointer pFVar2;
  iterator __position;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  undefined1 local_120 [8];
  Point ci;
  Point cj;
  undefined1 auStack_d8 [8];
  queue<OpenMesh::FaceHandle,_std::deque<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>
  queue_face_handle;
  undefined1 local_80 [8];
  vector<bool,_std::allocator<bool>_> flag;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> temp_face_neighbor;
  BaseHandle local_38;
  FaceHandle temp_face_handle_queue;
  FaceHandle temp_face_handle;
  FaceHandle fh_local;
  
  temp_face_handle_queue = fh;
  OpenMesh::
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  ::calc_face_centroid
            ((Point *)local_120,
             (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              *)mesh,(FaceHandle)fh.super_BaseHandle.idx_);
  iVar3 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x28))(mesh);
  auStack_d8 = (undefined1  [8])((ulong)auStack_d8 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_80,(long)iVar3,(bool *)auStack_d8,
             (allocator_type *)
             &flag.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  pFVar2 = (face_neighbor->
           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((face_neighbor->
      super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl.
      super__Vector_impl_data._M_finish != pFVar2) {
    (face_neighbor->super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)
    ._M_impl.super__Vector_impl_data._M_finish = pFVar2;
  }
  uVar5 = (ulong)(int)temp_face_handle_queue.super_BaseHandle.idx_;
  uVar4 = uVar5 + 0x3f;
  if (-1 < (long)uVar5) {
    uVar4 = uVar5;
  }
  *(ulong *)((long)local_80 +
            (((long)uVar4 >> 6) + ((ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) - 1))
            * 8) =
       *(ulong *)((long)local_80 +
                 (((long)uVar4 >> 6) +
                 ((ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) |
       1L << ((byte)temp_face_handle_queue.super_BaseHandle.idx_ & 0x3f);
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  auStack_d8 = (undefined1  [8])0x0;
  queue_face_handle.c.super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::_Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::_M_initialize_map
            ((_Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_d8,
             0);
  if ((_Elt_pointer)
      queue_face_handle.c.
      super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
      super__Deque_impl_data._M_start._M_node ==
      queue_face_handle.c.
      super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first + -1) {
    std::deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>::
    _M_push_back_aux<OpenMesh::FaceHandle_const&>
              ((deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>> *)auStack_d8,
               &temp_face_handle_queue);
  }
  else {
    *(BaseHandle *)
     queue_face_handle.c.
     super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
     super__Deque_impl_data._M_start._M_node = temp_face_handle_queue.super_BaseHandle.idx_;
    queue_face_handle.c.
    super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
    super__Deque_impl_data._M_start._M_node =
         (_Map_pointer)
         ((long)queue_face_handle.c.
                super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node + 4);
  }
  flag.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)0x0;
  temp_face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  temp_face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (queue_face_handle.c.
      super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
      super__Deque_impl_data._M_start._M_node !=
      (_Map_pointer)
      queue_face_handle.c.
      super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
      super__Deque_impl_data._M_map_size) {
    do {
      temp_face_neighbor.
      super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           *(int *)queue_face_handle.c.
                   super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                   _M_impl.super__Deque_impl_data._M_map_size;
      if ((BaseHandle)
          temp_face_neighbor.
          super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ !=
          temp_face_handle_queue.super_BaseHandle.idx_) {
        __position._M_current =
             (face_neighbor->
             super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (face_neighbor->
            super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>)._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>::
          _M_realloc_insert<OpenMesh::FaceHandle_const&>
                    ((vector<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>> *)
                     face_neighbor,__position,
                     (FaceHandle *)
                     ((long)&temp_face_neighbor.
                             super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        }
        else {
          ((__position._M_current)->super_BaseHandle).idx_ =
               temp_face_neighbor.
               super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          ppFVar1 = &(face_neighbor->
                     super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppFVar1 = *ppFVar1 + 1;
        }
      }
      if ((_Elt_pointer)
          queue_face_handle.c.
          super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
          super__Deque_impl_data._M_map_size ==
          queue_face_handle.c.
          super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
          super__Deque_impl_data._M_start._M_first + -1) {
        operator_delete(queue_face_handle.c.
                        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur);
        queue_face_handle.c.
        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Deque_impl_data._M_map_size =
             *(size_t *)
              (queue_face_handle.c.
               super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last + 2);
        queue_face_handle.c.
        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Deque_impl_data._M_start._M_first =
             (_Elt_pointer)
             (queue_face_handle.c.
              super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl
              .super__Deque_impl_data._M_map_size + 0x200);
        queue_face_handle.c.
        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur =
             (_Elt_pointer)
             queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_map_size;
        queue_face_handle.c.
        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Deque_impl_data._M_start._M_last =
             queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_start._M_last + 2;
      }
      else {
        queue_face_handle.c.
        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Deque_impl_data._M_map_size =
             queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_map_size + 4;
      }
      MeshDenoisingBase::getFaceNeighbor
                (&this->super_MeshDenoisingBase,mesh,
                 (FaceHandle)
                 temp_face_neighbor.
                 super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,kVertexBased,
                 (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                 &flag.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage);
      if (0 < (int)((ulong)((long)temp_face_neighbor.
                                  super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_start -
                           (long)flag.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_end_of_storage) >> 2)) {
        lVar6 = 0;
        do {
          local_38.idx_ =
               ((BaseHandle *)
               ((long)flag.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage + lVar6 * 4))->idx_;
          uVar5 = (ulong)local_38.idx_;
          uVar4 = uVar5 + 0x3f;
          if (-1 < (long)uVar5) {
            uVar4 = uVar5;
          }
          if ((*(ulong *)((long)local_80 +
                         (((long)uVar4 >> 6) +
                         ((ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) >>
               (uVar5 & 0x3f) & 1) == 0) {
            OpenMesh::
            PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
            ::calc_face_centroid
                      ((Point *)(ci.super_VectorDataT<double,_3>.values_ + 2),
                       (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                        *)mesh,(FaceHandle)local_38.idx_);
            dVar7 = (ci.super_VectorDataT<double,_3>.values_[1] -
                    cj.super_VectorDataT<double,_3>.values_[1]) *
                    (ci.super_VectorDataT<double,_3>.values_[1] -
                    cj.super_VectorDataT<double,_3>.values_[1]) +
                    ((double)local_120 - ci.super_VectorDataT<double,_3>.values_[2]) *
                    ((double)local_120 - ci.super_VectorDataT<double,_3>.values_[2]) +
                    (ci.super_VectorDataT<double,_3>.values_[0] -
                    cj.super_VectorDataT<double,_3>.values_[0]) *
                    (ci.super_VectorDataT<double,_3>.values_[0] -
                    cj.super_VectorDataT<double,_3>.values_[0]);
            if (dVar7 < 0.0) {
              dVar7 = sqrt(dVar7);
            }
            else {
              dVar7 = SQRT(dVar7);
            }
            if (dVar7 <= radius) {
              if ((_Elt_pointer)
                  queue_face_handle.c.
                  super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node ==
                  queue_face_handle.c.
                  super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first + -1) {
                std::deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>>::
                _M_push_back_aux<OpenMesh::FaceHandle_const&>
                          ((deque<OpenMesh::FaceHandle,std::allocator<OpenMesh::FaceHandle>> *)
                           auStack_d8,(FaceHandle *)&local_38);
              }
              else {
                *(int *)queue_face_handle.c.
                        super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node = local_38.idx_;
                queue_face_handle.c.
                super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node =
                     (_Map_pointer)
                     ((long)queue_face_handle.c.
                            super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node + 4);
              }
            }
            uVar5 = (ulong)local_38.idx_;
            uVar4 = uVar5 + 0x3f;
            if (-1 < (long)uVar5) {
              uVar4 = uVar5;
            }
            *(ulong *)((long)local_80 +
                      (((long)uVar4 >> 6) +
                      ((ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) =
                 *(ulong *)((long)local_80 +
                           (((long)uVar4 >> 6) +
                           ((ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) |
                 1L << ((byte)local_38.idx_ & 0x3f);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < (int)((ulong)((long)temp_face_neighbor.
                                             super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                             ._M_impl.super__Vector_impl_data._M_start -
                                      (long)flag.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                            super__Bvector_impl_data._M_end_of_storage) >> 2));
      }
    } while (queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_start._M_node !=
             (_Map_pointer)
             queue_face_handle.c.
             super__Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
             super__Deque_impl_data._M_map_size);
  }
  if (flag.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage != (_Bit_pointer)0x0) {
    operator_delete(flag.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                    ._M_end_of_storage);
  }
  std::_Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::~_Deque_base
            ((_Deque_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_d8)
  ;
  if (local_80 != (undefined1  [8])0x0) {
    operator_delete((void *)local_80);
  }
  return;
}

Assistant:

void GuidedMeshNormalFiltering::getRadiusBasedFaceNeighbor(TriMesh &mesh, TriMesh::FaceHandle fh, double radius, std::vector<TriMesh::FaceHandle> &face_neighbor)
{
    TriMesh::Point ci = mesh.calc_face_centroid(fh);
    std::vector<bool> flag((int)mesh.n_faces(), false);

    face_neighbor.clear();
    flag[fh.idx()] = true;
    std::queue<TriMesh::FaceHandle> queue_face_handle;
    queue_face_handle.push(fh);

    std::vector<TriMesh::FaceHandle> temp_face_neighbor;
    while(!queue_face_handle.empty())
    {
        TriMesh::FaceHandle temp_face_handle_queue = queue_face_handle.front();
        if(temp_face_handle_queue != fh)
            face_neighbor.push_back(temp_face_handle_queue);
        queue_face_handle.pop();
        getVertexBasedFaceNeighbor(mesh, temp_face_handle_queue, temp_face_neighbor);
        for(int i = 0; i < (int)temp_face_neighbor.size(); i++)
        {
            TriMesh::FaceHandle temp_face_handle = temp_face_neighbor[i];
            if(!flag[temp_face_handle.idx()])
            {
                TriMesh::Point cj = mesh.calc_face_centroid(temp_face_handle);
                double distance = (ci - cj).length();
                if(distance <= radius)
                    queue_face_handle.push(temp_face_handle);
                flag[temp_face_handle.idx()] = true;
            }
        }
    }
}